

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

void __thiscall FMapInfoParser::ParseIntermission(FMapInfoParser *this)

{
  bool bVar1;
  int iVar2;
  FIntermissionDescriptor *desc;
  FName local_1c;
  
  FScanner::MustGetString(&this->sc);
  iVar2 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
  desc = (FIntermissionDescriptor *)operator_new(0x18);
  *(undefined8 *)desc = 0;
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array =
       (FIntermissionAction **)0x0;
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Most = 0;
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count = 0;
  local_1c.Index = iVar2;
  ReplaceIntermission(&local_1c,desc);
  FScanner::MustGetToken(&this->sc,0x7b);
  while( true ) {
    bVar1 = FScanner::CheckToken(&this->sc,0x7d);
    if (bVar1) break;
    ParseIntermissionAction(this,desc);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseIntermission()
{
	sc.MustGetString();
	FName intname = sc.String;
	FIntermissionDescriptor *desc = new FIntermissionDescriptor();

	ReplaceIntermission(intname, desc);
	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		ParseIntermissionAction(desc);
	}
}